

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  Upsert *pUVar1;
  SrcList *pSVar2;
  long lVar3;
  TriggerStep *pTVar4;
  Upsert *pUpsert;
  long lVar5;
  
  if (pTrigger->pWhen != (Expr *)0x0) {
    walkExpr(pWalker,pTrigger->pWhen);
  }
  for (pTVar4 = pTrigger->step_list; pTVar4 != (TriggerStep *)0x0; pTVar4 = pTVar4->pNext) {
    sqlite3WalkSelect(pWalker,pTVar4->pSelect);
    if (pTVar4->pWhere != (Expr *)0x0) {
      walkExpr(pWalker,pTVar4->pWhere);
    }
    sqlite3WalkExprList(pWalker,pTVar4->pExprList);
    pUVar1 = pTVar4->pUpsert;
    if (pUVar1 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertSet);
      if (pUVar1->pUpsertWhere != (Expr *)0x0) {
        walkExpr(pWalker,pUVar1->pUpsertWhere);
      }
      if (pUVar1->pUpsertTargetWhere != (Expr *)0x0) {
        walkExpr(pWalker,pUVar1->pUpsertTargetWhere);
      }
    }
    if ((pTVar4->pFrom != (SrcList *)0x0) && (pSVar2 = pTVar4->pFrom, 0 < pSVar2->nSrc)) {
      lVar5 = 0x30;
      lVar3 = 0;
      do {
        sqlite3WalkSelect(pWalker,*(Select **)((long)pSVar2->a + lVar5 + -8));
        lVar3 = lVar3 + 1;
        pSVar2 = pTVar4->pFrom;
        lVar5 = lVar5 + 0x68;
      } while (lVar3 < pSVar2->nSrc);
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      for(i=0; i<pStep->pFrom->nSrc; i++){
        sqlite3WalkSelect(pWalker, pStep->pFrom->a[i].pSelect);
      }
    }
  }
}